

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O0

void __thiscall CEditor::CEditor(CEditor *this)

{
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffff78;
  CLayerGroup *in_stack_ffffffffffffff80;
  CLineInput *this_00;
  CLineInput *in_stack_ffffffffffffff90;
  CLayerQuads *this_01;
  undefined8 *puVar1;
  CEditorMap *this_02;
  vector3_base<float> local_30;
  vector3_base<float> local_24;
  vector4_base<float> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  IEditor::IEditor((IEditor *)in_stack_ffffffffffffff80);
  *in_RDI = &PTR__CEditor_00299cd0;
  CUI::CUI((CUI *)(in_RDI + 0xb));
  CLineInput::CLineInput(in_stack_ffffffffffffff90);
  IGraphics::CTextureHandle::CTextureHandle((CTextureHandle *)(in_RDI + 0x209));
  this_02 = (CEditorMap *)(in_RDI + 0x20d);
  sorted_array<CEditor::CFilelistItem,_allocator_default<CEditor::CFilelistItem>_>::sorted_array
            ((sorted_array<CEditor::CFilelistItem,_allocator_default<CEditor::CFilelistItem>_> *)
             0x202d6b);
  vector4_base<float>::vector4_base((vector4_base<float> *)((long)in_RDI + 0x10f4));
  vector3_base<float>::vector3_base((vector3_base<float> *)((long)in_RDI + 0x1104));
  vector3_base<float>::vector3_base((vector3_base<float> *)(in_RDI + 0x222));
  IGraphics::CTextureHandle::CTextureHandle((CTextureHandle *)((long)in_RDI + 0x111c));
  IGraphics::CTextureHandle::CTextureHandle((CTextureHandle *)(in_RDI + 0x224));
  IGraphics::CTextureHandle::CTextureHandle((CTextureHandle *)((long)in_RDI + 0x1124));
  IGraphics::CTextureHandle::CTextureHandle((CTextureHandle *)(in_RDI + 0x225));
  puVar1 = in_RDI + 0x226;
  CLayerGroup::CLayerGroup(in_stack_ffffffffffffff80);
  this_01 = (CLayerQuads *)(in_RDI + 0x230);
  CLayerTiles::CLayerTiles((CLayerTiles *)this_02,(int)((ulong)puVar1 >> 0x20),(int)puVar1);
  CLayerQuads::CLayerQuads(this_01);
  this_00 = (CLineInput *)(in_RDI + 0x248);
  CEditorMap::CEditorMap(this_02);
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  *(undefined4 *)(in_RDI + 0x8f) = 0;
  *(undefined4 *)((long)in_RDI + 0x47c) = 0;
  *(undefined4 *)(in_RDI + 0x90) = 0;
  in_RDI[0x91] = 0;
  *(undefined1 *)(in_RDI + 0x92) = 0;
  *(undefined4 *)((long)in_RDI + 0x494) = 1;
  *(undefined4 *)(in_RDI + 0x93) = 0;
  *(undefined1 *)((long)in_RDI + 0x49c) = 0;
  *(undefined1 *)((long)in_RDI + 0x69c) = 0;
  *(undefined1 *)((long)in_RDI + 0x89c) = 0;
  *(undefined4 *)((long)in_RDI + 0x8a4) = 0;
  *(undefined4 *)(in_RDI + 0x115) = 0;
  *(undefined4 *)((long)in_RDI + 0x8ac) = 0;
  *(undefined1 *)(in_RDI + 0x1dd) = 0;
  CLineInput::SetBuffer(this_00,in_stack_ffffffffffffff78,0);
  in_RDI[0x116] = 0;
  in_RDI[0x117] = 0;
  in_RDI[0x119] = 0;
  *(undefined1 *)(in_RDI + 0x11a) = 0;
  *(undefined1 *)(in_RDI + 0x15a) = 0;
  *(undefined1 *)(in_RDI + 0x19a) = 0;
  in_RDI[0x1da] = in_RDI + 0x15a;
  *(undefined1 *)(in_RDI + 0x1db) = 0;
  *(undefined4 *)(in_RDI + 0x1dc) = 0;
  *(undefined4 *)((long)in_RDI + 0xee4) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x20f) = 0;
  *(undefined4 *)((long)in_RDI + 0x107c) = 0;
  *(undefined4 *)(in_RDI + 0x210) = 999;
  *(undefined4 *)((long)in_RDI + 0x1084) = 0;
  *(undefined4 *)(in_RDI + 0x211) = 0;
  *(undefined4 *)((long)in_RDI + 0x108c) = 0;
  *(undefined4 *)(in_RDI + 0x212) = 0;
  *(undefined4 *)((long)in_RDI + 0x1094) = 0x3f800000;
  *(undefined4 *)(in_RDI + 0x213) = 200;
  *(undefined1 *)((long)in_RDI + 0x109c) = 0;
  *(undefined1 *)((long)in_RDI + 0x109d) = 1;
  *(undefined4 *)(in_RDI + 0x214) = 0;
  *(undefined4 *)((long)in_RDI + 0x10a4) = 0;
  *(undefined4 *)(in_RDI + 0x215) = 0;
  *(undefined4 *)((long)in_RDI + 0x10ac) = 0;
  *(undefined1 *)((long)in_RDI + 0x109e) = 1;
  *(undefined1 *)((long)in_RDI + 0x109f) = 0;
  *(undefined1 *)(in_RDI + 0x216) = 0;
  *(undefined1 *)((long)in_RDI + 0x10b1) = 1;
  *(undefined1 *)((long)in_RDI + 0x10b2) = 0;
  in_RDI[0x217] = 0;
  *(undefined4 *)(in_RDI + 0x218) = 0;
  *(undefined4 *)((long)in_RDI + 0x10c4) = 0x3f800000;
  *(undefined4 *)(in_RDI + 0x219) = 0;
  *(undefined4 *)((long)in_RDI + 0x10cc) = 0;
  *(undefined4 *)((long)in_RDI + 0x10ec) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x21d) = 0xffffffff;
  vector4_base<float>::vector4_base(&local_18,0.0,0.0,0.0,0.0);
  *(undefined8 *)((long)in_RDI + 0x10f4) = local_18._0_8_;
  *(undefined8 *)((long)in_RDI + 0x10fc) = local_18._8_8_;
  vector3_base<float>::vector3_base(&local_24,1.0,0.0,0.0);
  *(anon_union_4_4_d826a04f_for_vector3_base<float>_5 *)((long)in_RDI + 0x110c) = local_24.field_2;
  *(undefined8 *)((long)in_RDI + 0x1104) = local_24._0_8_;
  vector3_base<float>::vector3_base(&local_30,1.0,0.0,0.0);
  *(anon_union_4_4_d826a04f_for_vector3_base<float>_5 *)(in_RDI + 0x223) = local_30.field_2;
  in_RDI[0x222] = local_30._0_8_;
  ms_pUiGotContext = (void *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CEditor() : m_TilesetPicker(16, 16)
	{
		m_pInput = 0;
		m_pClient = 0;
		m_pGraphics = 0;
		m_pTextRender = 0;

		m_Mode = MODE_LAYERS;
		m_Dialog = 0;
		m_EditBoxActive = 0;
		m_pTooltip = 0;

		m_GridActive = false;
		m_GridFactor = 1;

		m_MouseEdMode = MOUSE_EDIT;

		m_aFileName[0] = 0;
		m_aFileSaveName[0] = 0;
		m_ValidSaveFilename = false;

		m_PopupEventActivated = false;
		m_PopupEventWasActivated = false;

		m_FileDialogStorageType = 0;
		m_aFileDialogFilterString[0] = '\0';
		m_FileDialogFilterInput.SetBuffer(m_aFileDialogFilterString, sizeof(m_aFileDialogFilterString));
		m_pFileDialogTitle = 0;
		m_pFileDialogButtonText = 0;
		m_pFileDialogUser = 0;
		m_aFileDialogFileName[0] = 0;
		m_aFileDialogCurrentFolder[0] = 0;
		m_aFileDialogCurrentLink[0] = 0;
		m_pFileDialogPath = m_aFileDialogCurrentFolder;
		m_aFileDialogActivate = false;
		m_FileDialogScrollValue = 0.0f;
		m_FilesSelectedIndex = -1;
		m_FilesStartAt = 0;
		m_FilesCur = 0;
		m_FilesStopAt = 999;

		m_WorldOffsetX = 0;
		m_WorldOffsetY = 0;
		m_EditorOffsetX = 0.0f;
		m_EditorOffsetY = 0.0f;

		m_WorldZoom = 1.0f;
		m_ZoomLevel = 200;
		m_LockMouse = false;
		m_ShowMousePointer = true;
		m_MouseDeltaX = 0;
		m_MouseDeltaY = 0;
		m_MouseDeltaWx = 0;
		m_MouseDeltaWy = 0;

		m_GuiActive = true;
		m_ProofBorders = false;

		m_ShowTileInfo = false;
		m_ShowDetail = true;
		m_Animate = false;
		m_AnimateStart = 0;
		m_AnimateTime = 0;
		m_AnimateSpeed = 1;

		m_ShowEnvelopeEditor = 0;

		m_ShowEnvelopePreview = SHOWENV_NONE;
		m_SelectedQuadEnvelope = -1;
		m_SelectedEnvelopePoint = -1;

		m_SelectedColor = vec4(0,0,0,0);
		m_InitialPickerColor = vec3(1,0,0);
		m_SelectedPickerColor = vec3(1,0,0);

		ms_pUiGotContext = 0;
	}